

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
ProxyListener::ProcessMessage(ProxyListener *this,ReceivedMessage *m,IpEndpointName *remoteEndpoint)

{
  byte bVar1;
  unsigned_long uVar2;
  UdpSocket *pUVar3;
  bool bVar4;
  int32 rhs;
  unsigned_long uVar5;
  char *pcVar6;
  size_t size;
  OutboundPacketStream *__s;
  float rhs_00;
  const_iterator arg;
  OutboundPacketStream p;
  MidiMessage local_bc;
  ReceivedMessageArgument local_b8;
  OutboundPacketStream local_a8 [2];
  
  if ((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    IpEndpointName::AddressAsString(remoteEndpoint,(char *)local_a8);
    uVar2 = remoteEndpoint->address;
    uVar5 = IpEndpointName::GetHostByName("localhost");
    if (uVar2 != uVar5) {
      pcVar6 = (char *)(this->host_)._M_string_length;
      __s = local_a8;
      strlen((char *)__s);
      std::__cxx11::string::_M_replace((ulong)&this->host_,0,pcVar6,(ulong)__s);
      connect(this,(int)&this->host_,(sockaddr *)(ulong)this->port_,(socklen_t)__s);
    }
  }
  pUVar3 = &((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->super_UdpSocket;
  if (pUVar3 != (UdpSocket *)0x0) {
    bVar4 = UdpSocket::IsBound(pUVar3);
    if (bVar4) {
      osc::OutboundPacketStream::OutboundPacketStream(local_a8,this->buffer_,0x400);
      local_b8.typeTagPtr_ = m->addressPattern_;
      osc::OutboundPacketStream::operator<<(local_a8,(BeginMessage *)&local_b8);
      local_b8.typeTagPtr_ = m->typeTagsBegin_;
      local_b8.argumentPtr_ = m->arguments_;
      while (local_b8.typeTagPtr_ != m->typeTagsEnd_) {
        bVar1 = *local_b8.typeTagPtr_;
        if (bVar1 < 0x6d) {
          if (bVar1 == 0x66) {
            rhs_00 = osc::ReceivedMessageArgument::AsFloat(&local_b8);
            osc::OutboundPacketStream::operator<<(local_a8,rhs_00);
          }
          else if (bVar1 == 0x69) {
            rhs = osc::ReceivedMessageArgument::AsInt32(&local_b8);
            osc::OutboundPacketStream::operator<<(local_a8,rhs);
          }
        }
        else if (bVar1 == 0x6d) {
          local_bc.value = osc::ReceivedMessageArgument::AsMidiMessage(&local_b8);
          osc::OutboundPacketStream::operator<<(local_a8,&local_bc);
        }
        else if (bVar1 == 0x73) {
          pcVar6 = osc::ReceivedMessageArgument::AsString(&local_b8);
          osc::OutboundPacketStream::operator<<(local_a8,pcVar6);
        }
        osc::ReceivedMessageArgumentIterator::Advance((ReceivedMessageArgumentIterator *)&local_b8);
      }
      osc::OutboundPacketStream::operator<<(local_a8,(MessageTerminator *)&osc::EndMessage);
      pUVar3 = &((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_UdpSocket;
      pcVar6 = osc::OutboundPacketStream::Data(local_a8);
      size = osc::OutboundPacketStream::Size(local_a8);
      UdpSocket::Send(pUVar3,pcVar6,size);
      osc::OutboundPacketStream::~OutboundPacketStream(local_a8);
    }
  }
  return;
}

Assistant:

void ProcessMessage(const osc::ReceivedMessage &m,
                        const IpEndpointName &remoteEndpoint) override {
        (void) remoteEndpoint; // suppress unused parameter warning

        try {
            if (!proxy_) {
                char host[128];
                remoteEndpoint.AddressAsString(host);
                if (remoteEndpoint.address == IpEndpointName("localhost").address) {
                    ;
                } else {
                    host_=host;
                    connect(host_,port_);
                }
            }
            if(!proxy_ || !proxy_->IsBound()) return;
            osc::OutboundPacketStream p(buffer_, OUTPUT_BUFFER_SIZE);

//            p << osc::BeginBundleImmediate;
            p << osc::BeginMessage(m.AddressPattern());
            osc::ReceivedMessage::const_iterator arg = m.ArgumentsBegin();
            while (arg != m.ArgumentsEnd()) {
                switch (arg->TypeTag()) {
                    case osc::INT32_TYPE_TAG : {
                        p << arg->AsInt32();
                        break;
                    };
                    case osc::FLOAT_TYPE_TAG : {
                        p << arg->AsFloat();
                        break;
                    };
                    case osc::STRING_TYPE_TAG : {
                        p << arg->AsString();
                        break;
                    };
                    case osc::MIDI_MESSAGE_TYPE_TAG : {
                        p << osc::MidiMessage(arg->AsMidiMessage());
                        break;
                    };

                    default:
                        break;
                }
                arg++;
            }


            p << osc::EndMessage;
//            p << osc::EndBundle;


            proxy_->Send(p.Data(), p.Size());
        } catch (osc::Exception &e) {
            // any parsing errors such as unexpected argument types, or
            // missing arguments get thrown as exceptions.
            std::cout << "error while parsing message: "
                      << m.AddressPattern() << ": " << e.what() << "\n";
        }


    }